

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop_measures.h
# Opt level: O0

Vector3<double> * __thiscall
S2::GetSurfaceIntegral<Vector3<double>>
          (Vector3<double> *__return_storage_ptr__,S2 *this,S2PointLoopSpan loop,
          _func_Vector3<double>_S2Point_ptr_S2Point_ptr_S2Point_ptr *f_tri)

{
  FloatType FVar1;
  double dVar2;
  VType VVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_type sVar7;
  reference pVVar8;
  ostream *poVar9;
  reference pVVar10;
  D local_140;
  D local_128;
  D local_110;
  D local_f8;
  Vector3<double> local_e0;
  Vector3_d local_c8;
  D local_b0;
  undefined1 local_98 [8];
  S2Point old_origin;
  S2LogMessage local_78;
  S2LogMessageVoidify local_65 [20];
  byte local_51;
  S2LogMessage local_50;
  S2LogMessageVoidify local_3d;
  int local_3c;
  undefined1 auStack_38 [4];
  int i;
  S2Point origin;
  _func_Vector3<double>_S2Point_ptr_S2Point_ptr_S2Point_ptr *f_tri_local;
  S2PointLoopSpan loop_local;
  
  origin.c_[2] = (VType)loop.super_S2PointSpan.len_;
  loop_local.super_S2PointSpan.ptr_ = loop.super_S2PointSpan.ptr_;
  f_tri_local = (_func_Vector3<double>_S2Point_ptr_S2Point_ptr_S2Point_ptr *)this;
  Vector3<double>::Vector3(__return_storage_ptr__);
  sVar7 = absl::Span<const_Vector3<double>_>::size((Span<const_Vector3<double>_> *)&f_tri_local);
  if (2 < sVar7) {
    pVVar8 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&f_tri_local,0);
    _auStack_38 = pVVar8->c_[0];
    origin.c_[0] = pVVar8->c_[1];
    origin.c_[1] = pVVar8->c_[2];
    for (local_3c = 1; iVar6 = local_3c + 1,
        sVar7 = absl::Span<const_Vector3<double>_>::size
                          ((Span<const_Vector3<double>_> *)&f_tri_local), (ulong)(long)iVar6 < sVar7
        ; local_3c = local_3c + 1) {
      local_51 = 0;
      bVar5 = true;
      if (local_3c != 1) {
        pVVar8 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&f_tri_local,local_3c);
        FVar1 = Vector3<double>::Angle((Vector3<double> *)auStack_38,pVVar8);
        bVar5 = FVar1 < 3.141582653589793;
      }
      if (!bVar5) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_50,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop_measures.h"
                   ,0xef,kFatal,(ostream *)&std::cerr);
        local_51 = 1;
        poVar9 = S2LogMessage::stream(&local_50);
        poVar9 = std::operator<<(poVar9,
                                 "Check failed: i == 1 || origin.Angle(loop[i]) < kMaxLength ");
        S2LogMessageVoidify::operator&(&local_3d,poVar9);
      }
      if ((local_51 & 1) != 0) {
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_50);
      }
      pVVar8 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&f_tri_local,0);
      bVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                        ((BasicVector<Vector3,_double,_3UL> *)auStack_38,pVVar8);
      old_origin.c_[2]._7_1_ = 0;
      bVar5 = true;
      if (!bVar4) {
        pVVar8 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&f_tri_local,0);
        dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                          ((BasicVector<Vector3,_double,_3UL> *)auStack_38,pVVar8);
        bVar5 = ABS(dVar2) < 1e-15;
      }
      if (!bVar5) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_78,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop_measures.h"
                   ,0xf0,kFatal,(ostream *)&std::cerr);
        old_origin.c_[2]._7_1_ = 1;
        poVar9 = S2LogMessage::stream(&local_78);
        poVar9 = std::operator<<(poVar9,
                                 "Check failed: origin == loop[0] || std::fabs(origin.DotProd(loop[0])) < 1e-15 "
                                );
        S2LogMessageVoidify::operator&(local_65,poVar9);
      }
      if ((old_origin.c_[2]._7_1_ & 1) != 0) {
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_78);
      }
      pVVar8 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&f_tri_local,local_3c + 1);
      FVar1 = Vector3<double>::Angle(pVVar8,(Vector3<double> *)auStack_38);
      if (3.141582653589793 < FVar1) {
        local_98 = (undefined1  [8])_auStack_38;
        old_origin.c_[0] = origin.c_[0];
        old_origin.c_[1] = origin.c_[1];
        pVVar8 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&f_tri_local,0);
        bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                          ((BasicVector<Vector3,_double,_3UL> *)auStack_38,pVVar8);
        if (bVar5) {
          pVVar8 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&f_tri_local,0);
          pVVar10 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&f_tri_local,local_3c);
          RobustCrossProd(&local_c8,pVVar8,pVVar10);
          util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
                    (&local_b0,(BasicVector<Vector3,_double,_3UL> *)&local_c8);
          _auStack_38 = local_b0.c_[0];
          origin.c_[0] = local_b0.c_[1];
          origin.c_[1] = local_b0.c_[2];
        }
        else {
          pVVar8 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&f_tri_local,local_3c);
          pVVar10 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&f_tri_local,0);
          FVar1 = Vector3<double>::Angle(pVVar8,pVVar10);
          if (3.141582653589793 <= FVar1) {
            pVVar8 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&f_tri_local,0);
            Vector3<double>::CrossProd(&local_e0,pVVar8,(Vector3<double> *)local_98);
            VVar3 = origin.c_[2];
            _auStack_38 = local_e0.c_[0];
            origin.c_[0] = local_e0.c_[1];
            origin.c_[1] = local_e0.c_[2];
            pVVar8 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&f_tri_local,0);
            (*(code *)VVar3)(&local_f8,pVVar8,local_98,auStack_38);
            util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+=
                      ((BasicVector<Vector3,_double,_3UL> *)__return_storage_ptr__,&local_f8);
          }
          else {
            pVVar8 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&f_tri_local,0);
            _auStack_38 = pVVar8->c_[0];
            origin.c_[0] = pVVar8->c_[1];
            origin.c_[1] = pVVar8->c_[2];
          }
        }
        VVar3 = origin.c_[2];
        pVVar8 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&f_tri_local,local_3c);
        (*(code *)VVar3)(&local_110,local_98,pVVar8,auStack_38);
        util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+=
                  ((BasicVector<Vector3,_double,_3UL> *)__return_storage_ptr__,&local_110);
      }
      VVar3 = origin.c_[2];
      pVVar8 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&f_tri_local,local_3c);
      pVVar10 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&f_tri_local,local_3c + 1);
      (*(code *)VVar3)(&local_128,auStack_38,pVVar8,pVVar10);
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+=
                ((BasicVector<Vector3,_double,_3UL> *)__return_storage_ptr__,&local_128);
    }
    pVVar8 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&f_tri_local,0);
    bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                      ((BasicVector<Vector3,_double,_3UL> *)auStack_38,pVVar8);
    VVar3 = origin.c_[2];
    if (bVar5) {
      sVar7 = absl::Span<const_Vector3<double>_>::size((Span<const_Vector3<double>_> *)&f_tri_local)
      ;
      pVVar8 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&f_tri_local,(int)sVar7 + -1);
      pVVar10 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&f_tri_local,0);
      (*(code *)VVar3)(&local_140,auStack_38,pVVar8,pVVar10);
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+=
                ((BasicVector<Vector3,_double,_3UL> *)__return_storage_ptr__,&local_140);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T GetSurfaceIntegral(S2PointLoopSpan loop,
                     T f_tri(const S2Point&, const S2Point&, const S2Point&)) {
  // We sum "f_tri" over a collection T of oriented triangles, possibly
  // overlapping.  Let the sign of a triangle be +1 if it is CCW and -1
  // otherwise, and let the sign of a point "x" be the sum of the signs of the
  // triangles containing "x".  Then the collection of triangles T is chosen
  // such that either:
  //
  //  (1) Each point in the loop interior has sign +1, and sign 0 otherwise; or
  //  (2) Each point in the loop exterior has sign -1, and sign 0 otherwise.
  //
  // The triangles basically consist of a "fan" from vertex 0 to every loop
  // edge that does not include vertex 0.  These triangles will always satisfy
  // either (1) or (2).  However, what makes this a bit tricky is that
  // spherical edges become numerically unstable as their length approaches
  // 180 degrees.  Of course there is not much we can do if the loop itself
  // contains such edges, but we would like to make sure that all the triangle
  // edges under our control (i.e., the non-loop edges) are stable.  For
  // example, consider a loop around the equator consisting of four equally
  // spaced points.  This is a well-defined loop, but we cannot just split it
  // into two triangles by connecting vertex 0 to vertex 2.
  //
  // We handle this type of situation by moving the origin of the triangle fan
  // whenever we are about to create an unstable edge.  We choose a new
  // location for the origin such that all relevant edges are stable.  We also
  // create extra triangles with the appropriate orientation so that the sum
  // of the triangle signs is still correct at every point.

  // The maximum length of an edge for it to be considered numerically stable.
  // The exact value is fairly arbitrary since it depends on the stability of
  // the "f_tri" function.  The value below is quite conservative but could be
  // reduced further if desired.
  static const double kMaxLength = M_PI - 1e-5;

  // The default constructor for T must initialize the value to zero.
  // (This is true for built-in types such as "double".)
  T sum = T();
  if (loop.size() < 3) return sum;

  S2Point origin = loop[0];
  for (int i = 1; i + 1 < loop.size(); ++i) {
    // Let V_i be loop[i], let O be the current origin, and let length(A,B)
    // be the length of edge (A,B).  At the start of each loop iteration, the
    // "leading edge" of the triangle fan is (O,V_i), and we want to extend
    // the triangle fan so that the leading edge is (O,V_i+1).
    //
    // Invariants:
    //  1. length(O,V_i) < kMaxLength for all (i > 1).
    //  2. Either O == V_0, or O is approximately perpendicular to V_0.
    //  3. "sum" is the oriented integral of f over the area defined by
    //     (O, V_0, V_1, ..., V_i).
    S2_DCHECK(i == 1 || origin.Angle(loop[i]) < kMaxLength);
    S2_DCHECK(origin == loop[0] || std::fabs(origin.DotProd(loop[0])) < 1e-15);

    if (loop[i + 1].Angle(origin) > kMaxLength) {
      // We are about to create an unstable edge, so choose a new origin O'
      // for the triangle fan.
      S2Point old_origin = origin;
      if (origin == loop[0]) {
        // The following point is well-separated from V_i and V_0 (and
        // therefore V_i+1 as well).
        origin = S2::RobustCrossProd(loop[0], loop[i]).Normalize();
      } else if (loop[i].Angle(loop[0]) < kMaxLength) {
        // All edges of the triangle (O, V_0, V_i) are stable, so we can
        // revert to using V_0 as the origin.
        origin = loop[0];
      } else {
        // (O, V_i+1) and (V_0, V_i) are antipodal pairs, and O and V_0 are
        // perpendicular.  Therefore V_0.CrossProd(O) is approximately
        // perpendicular to all of {O, V_0, V_i, V_i+1}, and we can choose
        // this point O' as the new origin.
        origin = loop[0].CrossProd(old_origin);

        // Advance the edge (V_0,O) to (V_0,O').
        sum += f_tri(loop[0], old_origin, origin);
      }
      // Advance the edge (O,V_i) to (O',V_i).
      sum += f_tri(old_origin, loop[i], origin);
    }
    // Advance the edge (O,V_i) to (O,V_i+1).
    sum += f_tri(origin, loop[i], loop[i+1]);
  }
  // If the origin is not V_0, we need to sum one more triangle.
  if (origin != loop[0]) {
    // Advance the edge (O,V_n-1) to (O,V_0).
    sum += f_tri(origin, loop[loop.size() - 1], loop[0]);
  }
  return sum;
}